

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

void __thiscall OutputRedirect::flush(OutputRedirect *this)

{
  CStringRef message;
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 *in_RDI;
  bool bVar4;
  int result;
  int in_stack_ffffffffffffffe4;
  BasicCStringRef<char> in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  do {
    iVar1 = fflush((FILE *)*in_RDI);
    bVar4 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (iVar1 != 0) {
    uVar3 = __cxa_allocate_exception(0x18);
    __errno_location();
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,"cannot flush stream");
    message.data_._4_4_ = iVar1;
    message.data_._0_4_ = in_stack_fffffffffffffff0;
    fmt::SystemError::SystemError
              ((SystemError *)in_stack_ffffffffffffffe8.data_,in_stack_ffffffffffffffe4,message);
    __cxa_throw(uVar3,&fmt::SystemError::typeinfo,fmt::SystemError::~SystemError);
  }
  return;
}

Assistant:

void OutputRedirect::flush() {
#if EOF != -1
# error "FMT_RETRY assumes return value of -1 indicating failure"
#endif
  int result = 0;
  FMT_RETRY(result, fflush(file_));
  if (result != 0)
    throw fmt::SystemError(errno, "cannot flush stream");
}